

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall
pbrt::PortalImageInfiniteLight::PortalImageInfiniteLight
          (PortalImageInfiniteLight *this,Transform *renderFromLight,Image *equiAreaImage,
          RGBColorSpace *imageColorSpace,Float scale,string *filename,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *p,Allocator alloc)

{
  array<pbrt::Point3<float>,_4> *this_00;
  Point3<float> *pPVar1;
  Point3<float> *this_01;
  Tuple2<pbrt::Point2,_int> TVar2;
  pointer pPVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  WindowedPiecewiseConstant2D *this_02;
  Image *this_03;
  bool bVar25;
  Allocator alloc_00;
  allocator_type allocator;
  long lVar26;
  long in_FS_OFFSET;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  MediumInterface MVar28;
  undefined1 extraout_var [56];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var_00 [56];
  undefined1 auVar40 [64];
  undefined1 auVar43 [60];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  Vector3<float> VVar44;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  allocator<char> local_309;
  Tuple3<pbrt::Vector3,_float> local_308;
  Tuple3<pbrt::Vector3,_float> local_2f8;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  WindowedPiecewiseConstant2D *local_2c8;
  Image *local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  string *local_290;
  Transform *local_288;
  Frame *local_280;
  Tuple2<pbrt::Point2,_float> local_278;
  Tuple2<pbrt::Point2,_float> local_270;
  _Any_data local_268;
  code *local_258;
  code *local_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  _Any_data local_228;
  code *pcStack_218;
  code *pcStack_210;
  Array2D<float> d;
  string local_1e0 [32];
  string local_1c0 [32];
  Array2D<float> local_1a0;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_180;
  ImageChannelDesc channelDesc;
  size_t vb;
  float fStack_140;
  float fStack_13c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_138;
  undefined1 local_128 [248];
  undefined1 auVar38 [56];
  undefined1 auVar39 [64];
  
  local_2d8._0_4_ = scale;
  MVar28._0_12_ = ZEXT812(0);
  MVar28.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits._4_4_ = 0;
  (this->super_LightBase).type = Infinite;
  (this->super_LightBase).mediumInterface = MVar28;
  uVar10 = *(undefined8 *)((renderFromLight->m).m[0] + 2);
  uVar11 = *(undefined8 *)(renderFromLight->m).m[1];
  uVar12 = *(undefined8 *)((renderFromLight->m).m[1] + 2);
  uVar13 = *(undefined8 *)(renderFromLight->m).m[2];
  uVar14 = *(undefined8 *)((renderFromLight->m).m[2] + 2);
  uVar15 = *(undefined8 *)(renderFromLight->m).m[3];
  uVar16 = *(undefined8 *)((renderFromLight->m).m[3] + 2);
  uVar17 = *(undefined8 *)(renderFromLight->mInv).m[0];
  uVar18 = *(undefined8 *)((renderFromLight->mInv).m[0] + 2);
  uVar19 = *(undefined8 *)(renderFromLight->mInv).m[1];
  uVar20 = *(undefined8 *)((renderFromLight->mInv).m[1] + 2);
  uVar21 = *(undefined8 *)(renderFromLight->mInv).m[2];
  uVar22 = *(undefined8 *)((renderFromLight->mInv).m[2] + 2);
  uVar23 = *(undefined8 *)(renderFromLight->mInv).m[3];
  uVar24 = *(undefined8 *)((renderFromLight->mInv).m[3] + 2);
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[0] =
       *(undefined8 *)(renderFromLight->m).m[0];
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[0] + 2) = uVar10;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[1] = uVar11;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[1] + 2) = uVar12;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[2] = uVar13;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[2] + 2) = uVar14;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[3] = uVar15;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[3] + 2) = uVar16;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[0] = uVar17;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[0] + 2) = uVar18;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[1] = uVar19;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[1] + 2) = uVar20;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[2] = uVar21;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[2] + 2) = uVar22;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[3] = uVar23;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[3] + 2) = uVar24;
  *(long *)(in_FS_OFFSET + -0x3a8) = *(long *)(in_FS_OFFSET + -0x3a8) + 1;
  local_290 = &this->filename;
  local_2e8._8_8_ = local_2e8._0_8_;
  local_2e8._0_8_ = filename;
  local_288 = renderFromLight;
  std::__cxx11::string::string((string *)local_290,(string *)filename);
  Image::Image(&this->image,alloc);
  this->imageColorSpace = imageColorSpace;
  local_280 = &this->portalFrame;
  this->scale = (Float)local_2d8._0_4_;
  local_2c0 = &this->image;
  Frame::Frame(local_280);
  this_00 = &this->portal;
  pstd::array<pbrt::Point3<float>,_4>::array(this_00);
  local_2c8 = &this->distribution;
  WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D(local_2c8,alloc);
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&vb,"R",(allocator<char> *)&d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"G",(allocator<char> *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_128 + 0x20),"B",(allocator<char> *)&local_2f8);
  requestedChannels.n = 3;
  requestedChannels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb;
  Image::GetChannelDesc(&channelDesc,equiAreaImage,requestedChannels);
  lVar26 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&vb + lVar26));
    auVar39._8_56_ = extraout_var_00;
    auVar39._0_8_ = extraout_XMM1_Qa;
    auVar43 = auVar39._4_60_;
    lVar26 = lVar26 + -0x20;
  } while (lVar26 != -0x20);
  if (channelDesc.offset.nStored == 0) {
    ErrorExit<std::__cxx11::string_const&>
              ("%s: image used for PortalImageInfiniteLight doesn\'t have R, G, B channels.",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_)
    ;
  }
  d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = 3;
  vb = channelDesc.offset.nStored;
  if (channelDesc.offset.nStored != 3) {
    LogFatal<char_const(&)[2],char_const(&)[19],char_const(&)[2],int&,char_const(&)[19],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
               ,0x3c6,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x49401b,
               (char (*) [19])"channelDesc.size()",(char (*) [2])0x49401b,(int *)&d,
               (char (*) [19])"channelDesc.size()",(unsigned_long *)&vb);
  }
  auVar38 = extraout_var;
  bVar25 = ImageChannelDesc::IsIdentity(&channelDesc);
  if (!bVar25) {
    LogFatal<char_const(&)[25]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
               ,0x3c7,"Check failed: %s",(char (*) [25])"channelDesc.IsIdentity()");
  }
  TVar2 = (equiAreaImage->resolution).super_Tuple2<pbrt::Point2,_int>;
  if (TVar2.x != TVar2.y) {
    d.extent.pMin.super_Tuple2<pbrt::Point2,_int> = TVar2;
    vb = (size_t)TVar2;
    ErrorExit<std::__cxx11::string_const&,int,int>
              ("%s: image resolution (%d, %d) is non-square. It\'s unlikely this is an equirect environment map."
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
               ,(int *)&vb,&d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
  }
  lVar26 = (long)(p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar26 != 0x30) {
    vb = lVar26 / 0xc;
    ErrorExit<unsigned_long>("Expected 4 vertices for infinite light portal but given %d",&vb);
  }
  for (lVar26 = 0; lVar26 != 0x30; lVar26 = lVar26 + 0xc) {
    pPVar3 = (p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)&(this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z + lVar26) =
         *(undefined4 *)((long)&(pPVar3->super_Tuple3<pbrt::Point3,_float>).z + lVar26);
    *(undefined8 *)((long)&(this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.x + lVar26) =
         *(undefined8 *)((long)&(pPVar3->super_Tuple3<pbrt::Point3,_float>).x + lVar26);
  }
  pPVar1 = (this->portal).values + 1;
  VVar44 = Point3<float>::operator-(pPVar1,this_00->values);
  fStack_140 = VVar44.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar30._0_8_ = VVar44.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar30._8_56_ = auVar38;
  vb = vmovlps_avx(auVar30._0_16_);
  VVar44 = Normalize<float>((Vector3<float> *)&vb);
  local_308.z = VVar44.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar31._0_8_ = VVar44.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar31._8_56_ = auVar38;
  this_01 = (this->portal).values + 2;
  local_308._0_8_ = vmovlps_avx(auVar31._0_16_);
  VVar44 = Point3<float>::operator-(this_01,pPVar1);
  fStack_140 = VVar44.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar32._0_8_ = VVar44.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar32._8_56_ = auVar38;
  vb = vmovlps_avx(auVar32._0_16_);
  VVar44 = Normalize<float>((Vector3<float> *)&vb);
  auVar40._0_4_ = VVar44.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar40._4_60_ = auVar43;
  auVar33._0_8_ = VVar44.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar33._8_56_ = auVar38;
  local_2d8 = auVar33._0_16_;
  local_2e8 = auVar40._0_16_;
  pPVar1 = (this->portal).values + 3;
  VVar44 = Point3<float>::operator-(this_01,pPVar1);
  auVar43 = auVar40._4_60_;
  fStack_140 = VVar44.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar34._0_8_ = VVar44.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar34._8_56_ = auVar38;
  vb = vmovlps_avx(auVar34._0_16_);
  VVar44 = Normalize<float>((Vector3<float> *)&vb);
  auVar41._0_4_ = VVar44.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar41._4_60_ = auVar43;
  auVar35._0_8_ = VVar44.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar35._8_56_ = auVar38;
  local_2b8 = auVar35._0_16_;
  local_2a8 = auVar41._0_16_;
  VVar44 = Point3<float>::operator-(pPVar1,this_00->values);
  auVar43 = auVar41._4_60_;
  fStack_140 = VVar44.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar36._0_8_ = VVar44.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar36._8_56_ = auVar38;
  vb = vmovlps_avx(auVar36._0_16_);
  VVar44 = Normalize<float>((Vector3<float> *)&vb);
  auVar42._0_4_ = VVar44.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar42._4_60_ = auVar43;
  auVar37._0_8_ = VVar44.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar37._8_56_ = auVar38;
  local_2f8._0_8_ = vmovlps_avx(auVar37._0_16_);
  local_248 = vmovshdup_avx(local_2b8);
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(local_248._0_4_ * local_308.y)),
                            ZEXT416((uint)local_308.x),local_2b8);
  auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)local_308.z),ZEXT416((uint)local_2a8._0_4_));
  auVar4._8_4_ = 0x7fffffff;
  auVar4._0_8_ = 0x7fffffff7fffffff;
  auVar4._12_4_ = 0x7fffffff;
  auVar27 = vandps_avx512vl(ZEXT416((uint)(auVar27._0_4_ + -1.0)),auVar4);
  local_238 = vmovshdup_avx(local_2d8);
  local_2f8.z = auVar42._0_4_;
  if (0.001 < auVar27._0_4_) {
LAB_003a1899:
    Error<>("Infinite light portal isn\'t a planar quadrilateral");
  }
  else {
    auVar27._0_4_ = local_2d8._0_4_ * VVar44.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar27._4_4_ = local_2d8._4_4_ * VVar44.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar27._8_4_ = local_2d8._8_4_ * auVar38._0_4_;
    auVar27._12_4_ = local_2d8._12_4_ * auVar38._4_4_;
    auVar27 = vmovshdup_avx(auVar27);
    auVar27 = vfmadd231ss_fma(auVar27,local_2d8,auVar37._0_16_);
    auVar27 = vfmadd132ss_fma(auVar42._0_16_,auVar27,ZEXT416((uint)local_2e8._0_4_));
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar27 = vandps_avx512vl(ZEXT416((uint)(auVar27._0_4_ + -1.0)),auVar5);
    if (0.001 < auVar27._0_4_) goto LAB_003a1899;
  }
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(local_308.y * (float)local_238._0_4_)),
                            ZEXT416((uint)local_308.x),ZEXT416((uint)local_2d8._0_4_));
  auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)local_308.z),ZEXT416((uint)local_2e8._0_4_));
  auVar6._8_4_ = 0x7fffffff;
  auVar6._0_8_ = 0x7fffffff7fffffff;
  auVar6._12_4_ = 0x7fffffff;
  auVar27 = vandps_avx512vl(auVar27,auVar6);
  if (auVar27._0_4_ <= 0.001) {
    auVar27 = vfmadd132ss_fma(local_2d8,
                              ZEXT416((uint)((float)local_238._0_4_ * (float)local_248._0_4_)),
                              ZEXT416((uint)local_2b8._0_4_));
    auVar27 = vfmadd132ss_fma(local_2e8,auVar27,ZEXT416((uint)local_2a8._0_4_));
    auVar7._8_4_ = 0x7fffffff;
    auVar7._0_8_ = 0x7fffffff7fffffff;
    auVar7._12_4_ = 0x7fffffff;
    auVar27 = vandps_avx512vl(auVar27,auVar7);
    if (auVar27._0_4_ <= 0.001) {
      auVar27 = vfmadd231ss_fma(ZEXT416((uint)(local_2f8.y * (float)local_248._0_4_)),
                                ZEXT416((uint)local_2f8.x),ZEXT416((uint)local_2b8._0_4_));
      auVar27 = vfmadd213ss_fma(local_2a8,ZEXT416((uint)local_2f8.z),auVar27);
      auVar8._8_4_ = 0x7fffffff;
      auVar8._0_8_ = 0x7fffffff7fffffff;
      auVar8._12_4_ = 0x7fffffff;
      auVar27 = vandps_avx512vl(auVar27,auVar8);
      if (auVar27._0_4_ <= 0.001) {
        auVar27 = vfmadd213ss_fma(ZEXT416((uint)local_308.x),ZEXT416((uint)local_2f8.x),
                                  ZEXT416((uint)(local_308.y * local_2f8.y)));
        auVar27 = vfmadd213ss_fma(ZEXT416((uint)local_308.z),ZEXT416((uint)local_2f8.z),auVar27);
        auVar9._8_4_ = 0x7fffffff;
        auVar9._0_8_ = 0x7fffffff7fffffff;
        auVar9._12_4_ = 0x7fffffff;
        auVar27 = vandps_avx512vl(auVar27,auVar9);
        if (auVar27._0_4_ <= 0.001) goto LAB_003a19a5;
      }
    }
  }
  Error<>("Infinite light portal isn\'t a planar quadrilateral");
LAB_003a19a5:
  Frame::FromXY((Frame *)&vb,(Vector3f *)&local_308,(Vector3f *)&local_2f8);
  (local_280->z).super_Tuple3<pbrt::Vector3,_float>.z = (float)local_128._0_4_;
  (local_280->x).super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)vb;
  (local_280->x).super_Tuple3<pbrt::Vector3,_float>.y = (float)vb._4_4_;
  *(ulong *)&(local_280->x).super_Tuple3<pbrt::Vector3,_float>.z = CONCAT44(fStack_13c,fStack_140);
  (local_280->y).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)aStack_138._M_allocated_capacity._0_4_;
  (local_280->y).super_Tuple3<pbrt::Vector3,_float>.z =
       (float)aStack_138._M_allocated_capacity._4_4_;
  (local_280->z).super_Tuple3<pbrt::Vector3,_float>.x = (float)aStack_138._8_4_;
  (local_280->z).super_Tuple3<pbrt::Vector3,_float>.y = (float)aStack_138._12_4_;
  TVar2 = (equiAreaImage->resolution).super_Tuple2<pbrt::Point2,_int>;
  std::__cxx11::string::string<std::allocator<char>>((string *)&d,"R",(allocator<char> *)&local_270)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"G",(allocator<char> *)&local_278);
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"B",&local_309);
  local_180.bits =
       (equiAreaImage->encoding).
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       .bits;
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d;
  Image::Image((Image *)&vb,Float,(Point2i)TVar2,channels,(ColorEncodingHandle *)&local_180,alloc);
  this_03 = local_2c0;
  Image::operator=(local_2c0,(Image *)&vb);
  Image::~Image((Image *)&vb);
  lVar26 = 0x40;
  do {
    std::__cxx11::string::~string(local_1e0 + lVar26 + -0x20);
    lVar26 = lVar26 + -0x20;
  } while (lVar26 != -0x20);
  TVar2 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  local_228._M_unused._M_object = (void *)0x0;
  local_228._8_8_ = 0;
  pcStack_218 = (code *)0x0;
  pcStack_210 = (code *)0x0;
  local_228._M_unused._M_object = operator_new(0x18);
  *(PortalImageInfiniteLight **)local_228._M_unused._0_8_ = this;
  pcStack_210 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp:998:42)>
                ::_M_invoke;
  *(Transform **)((long)local_228._M_unused._0_8_ + 8) = local_288;
  *(Image **)((long)local_228._M_unused._0_8_ + 0x10) = equiAreaImage;
  pcStack_218 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp:998:42)>
                ::_M_manager;
  ParallelFor(0,(long)TVar2 >> 0x20,(function<void_(long)> *)&local_228);
  std::_Function_base::~_Function_base((_Function_base *)&local_228);
  auVar29._8_4_ = 0x3f800000;
  auVar29._0_8_ = 0x3f8000003f800000;
  auVar29._12_4_ = 0x3f800000;
  local_268._8_8_ = 0;
  local_270.x = 0.0;
  local_270.y = 0.0;
  local_250 = std::
              _Function_handler<float_(pbrt::Point2<float>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp:1018:18)>
              ::_M_invoke;
  local_258 = std::
              _Function_handler<float_(pbrt::Point2<float>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp:1018:18)>
              ::_M_manager;
  local_278 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar29);
  local_268._M_unused._M_object = this;
  Bounds2<float>::Bounds2
            ((Bounds2<float> *)&vb,(Point2<float> *)&local_270,(Point2<float> *)&local_278);
  alloc_00.memoryResource = pstd::pmr::new_delete_resource();
  Image::GetSamplingDistribution
            (&d,this_03,(function<float_(pbrt::Point2<float>)> *)&local_268,(Bounds2f *)&vb,alloc_00
            );
  std::_Function_base::~_Function_base((_Function_base *)&local_268);
  allocator.memoryResource = pstd::pmr::new_delete_resource();
  Array2D<float>::Array2D(&local_1a0,&d,allocator);
  this_02 = local_2c8;
  WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D
            ((WindowedPiecewiseConstant2D *)&vb,&local_1a0,alloc);
  WindowedPiecewiseConstant2D::operator=(this_02,(WindowedPiecewiseConstant2D *)&vb);
  WindowedPiecewiseConstant2D::~WindowedPiecewiseConstant2D((WindowedPiecewiseConstant2D *)&vb);
  Array2D<float>::~Array2D(&local_1a0);
  Array2D<float>::~Array2D(&d);
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&channelDesc.offset)
  ;
  return;
}

Assistant:

PortalImageInfiniteLight::PortalImageInfiniteLight(
    const Transform &renderFromLight, Image equiAreaImage,
    const RGBColorSpace *imageColorSpace, Float scale, const std::string &filename,
    std::vector<Point3f> p, Allocator alloc)
    : LightBase(LightType::Infinite, renderFromLight, MediumInterface()),
      image(alloc),
      imageColorSpace(imageColorSpace),
      scale(scale),
      filename(filename),
      distribution(alloc) {
    // Initialize sampling PDFs for infinite area light
    ImageChannelDesc channelDesc = equiAreaImage.GetChannelDesc({"R", "G", "B"});
    if (!channelDesc)
        ErrorExit("%s: image used for PortalImageInfiniteLight doesn't have R, "
                  "G, B channels.",
                  filename);
    CHECK_EQ(3, channelDesc.size());
    CHECK(channelDesc.IsIdentity());

    if (equiAreaImage.Resolution().x != equiAreaImage.Resolution().y)
        ErrorExit("%s: image resolution (%d, %d) is non-square. It's unlikely "
                  "this is an "
                  "equirect environment map.",
                  filename, equiAreaImage.Resolution().x, equiAreaImage.Resolution().y);

    if (p.size() != 4)
        ErrorExit("Expected 4 vertices for infinite light portal but given %d", p.size());
    for (int i = 0; i < 4; ++i)
        portal[i] = p[i];

    // Compute frame for portal coordinate system
    Vector3f p01 = Normalize(portal[1] - portal[0]);
    Vector3f p12 = Normalize(portal[2] - portal[1]);
    Vector3f p32 = Normalize(portal[2] - portal[3]);
    Vector3f p03 = Normalize(portal[3] - portal[0]);
    // Do opposite edges have the same direction?
    if (std::abs(Dot(p01, p32) - 1) > .001 || std::abs(Dot(p12, p03) - 1) > .001)
        Error("Infinite light portal isn't a planar quadrilateral");
    // Sides perpendicular?
    if (std::abs(Dot(p01, p12)) > .001 || std::abs(Dot(p12, p32)) > .001 ||
        std::abs(Dot(p32, p03)) > .001 || std::abs(Dot(p03, p01)) > .001)
        Error("Infinite light portal isn't a planar quadrilateral");
    portalFrame = Frame::FromXY(p01, p03);

    // Resample environment map into rectified coordinates
    // Resample the latlong map into rectified coordinates
    image = Image(PixelFormat::Float, equiAreaImage.Resolution(), {"R", "G", "B"},
                  equiAreaImage.Encoding(), alloc);
    ParallelFor(0, image.Resolution().y, [&](int y) {
        for (int x = 0; x < image.Resolution().x; ++x) {
            // [0,1]^2 image coordinates
            Point2f st((x + 0.5f) / image.Resolution().x,
                       (y + 0.5f) / image.Resolution().y);

            Vector3f w = RenderFromImage(st);

            w = Normalize(renderFromLight.ApplyInverse(w));

            WrapMode2D equiAreaWrap(WrapMode::OctahedralSphere,
                                    WrapMode::OctahedralSphere);
            Point2f stEqui = EqualAreaSphereToSquare(w);
            for (int c = 0; c < 3; ++c)
                image.SetChannel({x, y}, c,
                                 equiAreaImage.BilerpChannel(stEqui, c, equiAreaWrap));
        }
    });

    // Initialize sampling PDFs for infinite area light
    auto duvdw = [&](const Point2f &p) {
        Float duv_dw;
        (void)RenderFromImage(p, &duv_dw);
        return duv_dw;
    };
    Array2D<Float> d = image.GetSamplingDistribution(duvdw);
    distribution = WindowedPiecewiseConstant2D(d, alloc);
}